

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Padding_x86::forward_int8(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  Mat *in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  bool bVar9;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat m_4;
  Mat borderm_1;
  int z;
  int64_t pad_value_3;
  int64_t v8_3;
  int q_1;
  int outd;
  int outh_2;
  int outw_3;
  Mat m_1;
  int64_t pad_value_2;
  int64_t v8_2;
  Mat borderm;
  int q;
  int front_;
  size_t out_elemsize_2;
  int out_elempack_2;
  int outc;
  int outh_1;
  int outw_2;
  int64_t pad_value_1;
  int64_t v8_1;
  size_t out_elemsize_1;
  int out_elempack_1;
  int outh;
  int outw_1;
  int64_t pad_value;
  int64_t v8;
  size_t out_elemsize;
  int out_elempack;
  int outw;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_3;
  Mat *m;
  Mat *m_5;
  Mat *m_2;
  int i_1;
  long *ptr_1;
  int size_1;
  int i;
  long *ptr;
  int size;
  size_t in_stack_fffffffffffff668;
  Allocator *in_stack_fffffffffffff670;
  undefined8 *puVar10;
  int in_stack_fffffffffffff678;
  int in_stack_fffffffffffff67c;
  undefined4 in_stack_fffffffffffff680;
  int in_stack_fffffffffffff684;
  undefined8 in_stack_fffffffffffff688;
  int _w;
  Mat *in_stack_fffffffffffff690;
  Mat *in_stack_fffffffffffff698;
  Mat *in_stack_fffffffffffff6a0;
  Mat *pMVar11;
  int in_stack_fffffffffffff6e0;
  Allocator *in_stack_fffffffffffff6e8;
  Allocator *in_stack_fffffffffffff6f0;
  undefined1 local_808 [40];
  int local_7e0;
  int local_7dc;
  int local_7d8;
  int local_7d4;
  int local_7d0;
  size_t local_7c8;
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined4 local_7a8;
  Allocator *local_7a0;
  undefined4 local_798;
  undefined4 local_794;
  undefined4 local_790;
  undefined4 local_78c;
  undefined4 local_788;
  undefined8 local_780;
  Mat local_778;
  undefined8 local_730;
  undefined8 local_728;
  undefined8 local_720;
  undefined4 local_718;
  Allocator *local_710;
  undefined4 local_708;
  undefined4 local_704;
  undefined4 local_700;
  undefined4 local_6fc;
  undefined4 local_6f8;
  undefined8 local_6f0;
  Mat local_6e8;
  int local_69c;
  ulong local_698;
  ulong local_690;
  int local_688;
  int local_684;
  int local_680;
  int local_67c;
  Mat local_678;
  ulong local_620;
  ulong local_618;
  Mat local_610;
  undefined4 in_stack_fffffffffffffa38;
  int iVar12;
  undefined4 in_stack_fffffffffffffa3c;
  Mat *in_stack_fffffffffffffa40;
  int in_stack_fffffffffffffa48;
  int in_stack_fffffffffffffa4c;
  int in_stack_fffffffffffffa50;
  int in_stack_fffffffffffffa54;
  int local_3bc;
  int local_394;
  
  iVar7 = in_RSI->w;
  iVar12 = in_RSI->h;
  iVar1 = in_RSI->d;
  iVar2 = in_RSI->c;
  iVar3 = in_RSI->dims;
  iVar4 = in_RSI->elempack;
  if (iVar4 == 8) {
    _w = (int)((ulong)in_stack_fffffffffffff688 >> 0x20);
    if (iVar3 == 1) {
      iVar6 = 1;
      if ((iVar7 * 8 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc)) % 8 == 0) {
        iVar6 = 8;
      }
      if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) % 8 == 0) && (iVar6 == 8)) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)) {
        Mat::create(in_stack_fffffffffffff690,_w,
                    CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                    in_stack_fffffffffffff67c,in_stack_fffffffffffff670);
        bVar9 = true;
        if (in_RDX->data != (void *)0x0) {
          bVar9 = in_RDX->cstep * (long)in_RDX->c == 0;
        }
        if (!bVar9) {
          uVar8 = (ulong)*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
          padding_constant_pack8_int8_sse
                    (in_RSI,in_RDX,0,0,
                     *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) / 8,
                     *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) / 8,
                     uVar8 | uVar8 << 8 | uVar8 << 0x10 | uVar8 << 0x18 | uVar8 << 0x20 |
                     uVar8 << 0x28 | uVar8 << 0x30 | uVar8 << 0x38);
          return 0;
        }
        return -100;
      }
    }
    if (iVar3 == 2) {
      iVar6 = 1;
      if ((iVar12 * 8 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)) % 8 == 0) {
        iVar6 = 8;
      }
      if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) && (iVar6 == 8)) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)) {
        Mat::create(in_stack_fffffffffffff690,_w,(int)in_stack_fffffffffffff688,
                    CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                    in_stack_fffffffffffff67c,in_stack_fffffffffffff670);
        bVar9 = true;
        if (in_RDX->data != (void *)0x0) {
          bVar9 = in_RDX->cstep * (long)in_RDX->c == 0;
        }
        if (!bVar9) {
          uVar8 = (ulong)*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
          padding_constant_pack8_int8_sse
                    (in_RSI,in_RDX,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) / 8,
                     *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 8,
                     *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),
                     *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc),
                     uVar8 | uVar8 << 8 | uVar8 << 0x10 | uVar8 << 0x18 | uVar8 << 0x20 |
                     uVar8 << 0x28 | uVar8 << 0x30 | uVar8 << 0x38);
          return 0;
        }
        return -100;
      }
    }
    iVar6 = (int)((ulong)in_stack_fffffffffffff670 >> 0x20);
    if (iVar3 == 3) {
      in_stack_fffffffffffffa54 =
           iVar7 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
           *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
      in_stack_fffffffffffffa50 =
           iVar12 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
           *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      in_stack_fffffffffffffa4c =
           iVar2 * 8 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
           *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
      in_stack_fffffffffffffa48 = 1;
      if (in_stack_fffffffffffffa4c % 8 == 0) {
        in_stack_fffffffffffffa48 = 8;
      }
      in_stack_fffffffffffffa40 = (Mat *)((in_RSI->elemsize / 8) * (long)in_stack_fffffffffffffa48);
      if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) % 8 == 0) &&
          (in_stack_fffffffffffffa48 == 8)) &&
         ((in_stack_fffffffffffffa4c == iVar2 * 8 ||
          (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)))) {
        Mat::create(in_stack_fffffffffffff690,_w,(int)in_stack_fffffffffffff688,
                    in_stack_fffffffffffff684,
                    CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),iVar6,
                    in_stack_fffffffffffff6f0);
        bVar9 = true;
        if (in_RDX->data != (void *)0x0) {
          bVar9 = in_RDX->cstep * (long)in_RDX->c == 0;
        }
        if (!bVar9) {
          iVar7 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) / 8;
          for (iVar12 = 0; iVar12 < in_stack_fffffffffffffa4c / in_stack_fffffffffffffa48;
              iVar12 = iVar12 + 1) {
            local_610.w = in_RDX->w;
            local_610.h = in_RDX->h;
            local_610.c = in_RDX->d;
            local_610.data =
                 (void *)((long)in_RDX->data + in_RDX->cstep * (long)iVar12 * in_RDX->elemsize);
            local_610.elemsize = in_RDX->elemsize;
            local_610.elempack = in_RDX->elempack;
            local_610.allocator = in_RDX->allocator;
            local_610.refcount = (int *)0x0;
            local_610.d = 1;
            local_610.cstep =
                 ((long)local_610.w * (long)local_610.h * local_610.elemsize + 0xf &
                 0xfffffffffffffff0) / local_610.elemsize;
            local_610.dims = in_RDX->dims + -1;
            if (in_RDX->dims == 4) {
              local_610.cstep = (long)in_RDX->w * (long)in_RDX->h;
            }
            local_618 = (ulong)*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
            local_620 = local_618 | local_618 << 8 | local_618 << 0x10 | local_618 << 0x18 |
                        local_618 << 0x20 | local_618 << 0x28 | local_618 << 0x30 |
                        local_618 << 0x38;
            if ((iVar12 - iVar7 < 0) || (iVar2 <= iVar12 - iVar7)) {
              for (local_394 = 0; local_394 < (int)local_610.cstep * local_610.c;
                  local_394 = local_394 + 1) {
                *(ulong *)((long)local_610.data + (long)local_394 * 8) = local_620;
              }
            }
            else {
              local_678.w = in_RSI->w;
              local_678.h = in_RSI->h;
              local_678.c = in_RSI->d;
              local_678.data =
                   (void *)((long)in_RSI->data +
                           in_RSI->cstep * (long)(iVar12 - iVar7) * in_RSI->elemsize);
              local_678.elemsize = in_RSI->elemsize;
              local_678.elempack = in_RSI->elempack;
              local_678.allocator = in_RSI->allocator;
              local_678.refcount = (int *)0x0;
              local_678.d = 1;
              local_678.cstep =
                   ((long)local_678.w * (long)local_678.h * local_678.elemsize + 0xf &
                   0xfffffffffffffff0) / local_678.elemsize;
              local_678.dims = in_RSI->dims + -1;
              if (in_RSI->dims == 4) {
                local_678.cstep = (long)in_RSI->w * (long)in_RSI->h;
              }
              if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
                lVar5 = *(long *)(*in_RDI + -0x18);
                padding_constant_pack8_int8_sse
                          (&local_678,&local_610,*(int *)((long)in_RDI + lVar5 + 0xd0),
                           *(int *)((long)in_RDI + lVar5 + 0xd4),
                           *(int *)((long)in_RDI + lVar5 + 0xd8),
                           *(int *)((long)in_RDI + lVar5 + 0xdc),local_620);
              }
              if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1) {
                lVar5 = *(long *)(*in_RDI + -0x18);
                padding_replicate_pack8_int8_sse
                          (&local_678,&local_610,*(int *)((long)in_RDI + lVar5 + 0xd0),
                           *(int *)((long)in_RDI + lVar5 + 0xd4),
                           *(int *)((long)in_RDI + lVar5 + 0xd8),
                           *(int *)((long)in_RDI + lVar5 + 0xdc));
              }
              if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 2) {
                lVar5 = *(long *)(*in_RDI + -0x18);
                padding_reflect_pack8_int8_sse
                          (&local_678,&local_610,*(int *)((long)in_RDI + lVar5 + 0xd0),
                           *(int *)((long)in_RDI + lVar5 + 0xd4),
                           *(int *)((long)in_RDI + lVar5 + 0xd8),
                           *(int *)((long)in_RDI + lVar5 + 0xdc));
              }
              if (local_678.refcount != (int *)0x0) {
                LOCK();
                iVar1 = *local_678.refcount;
                *local_678.refcount = *local_678.refcount + -1;
                UNLOCK();
                if (iVar1 == 1) {
                  if (local_678.allocator == (Allocator *)0x0) {
                    if (local_678.data != (void *)0x0) {
                      free(local_678.data);
                    }
                  }
                  else {
                    (*(local_678.allocator)->_vptr_Allocator[3])(local_678.allocator,local_678.data)
                    ;
                  }
                }
              }
              local_678.data = (void *)0x0;
              local_678.elemsize = 0;
              local_678.elempack = 0;
              local_678.dims = 0;
              local_678.w = 0;
              local_678.h = 0;
              local_678.d = 0;
              local_678.c = 0;
              local_678.cstep = 0;
              local_678.refcount = (int *)0x0;
            }
            if (local_610.refcount != (int *)0x0) {
              LOCK();
              iVar1 = *local_610.refcount;
              *local_610.refcount = *local_610.refcount + -1;
              UNLOCK();
              if (iVar1 == 1) {
                if (local_610.allocator == (Allocator *)0x0) {
                  if (local_610.data != (void *)0x0) {
                    free(local_610.data);
                  }
                }
                else {
                  (*(local_610.allocator)->_vptr_Allocator[3])(local_610.allocator,local_610.data);
                }
              }
            }
          }
          return 0;
        }
        return -100;
      }
    }
    if (iVar3 == 4) {
      local_67c = iVar7 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
      local_680 = iVar12 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_684 = iVar1 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                    in_stack_fffffffffffff67c,in_stack_fffffffffffff678,iVar6,
                    (int)in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                    in_stack_fffffffffffff6e0,in_stack_fffffffffffff6e8);
        bVar9 = true;
        if (in_RDX->data != (void *)0x0) {
          bVar9 = in_RDX->cstep * (long)in_RDX->c == 0;
        }
        if (!bVar9) {
          for (local_688 = 0; local_688 < iVar2; local_688 = local_688 + 1) {
            local_690 = (ulong)*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
            local_698 = local_690 | local_690 << 8 | local_690 << 0x10 | local_690 << 0x18 |
                        local_690 << 0x20 | local_690 << 0x28 | local_690 << 0x30 |
                        local_690 << 0x38;
            for (local_69c = 0; local_69c < local_684; local_69c = local_69c + 1) {
              local_6e8.w = in_RDX->w;
              local_6e8.h = in_RDX->h;
              local_6e8.elemsize = in_RDX->elemsize;
              local_6e8.elempack = in_RDX->elempack;
              local_710 = in_RDX->allocator;
              local_6e8.data =
                   (void *)((long)in_RDX->data +
                           (long)local_6e8.w * (long)local_6e8.h * (long)local_69c *
                           local_6e8.elemsize + in_RDX->cstep * (long)local_688 * in_RDX->elemsize);
              local_6e8.cstep = (long)local_6e8.w * (long)local_6e8.h;
              local_6e8.c = 1;
              local_6e8.d = 1;
              local_6e8.dims = 2;
              local_6e8.refcount = (int *)0x0;
              local_730 = 0;
              local_720 = 0;
              local_718 = 0;
              local_708 = 0;
              local_704 = 0;
              local_700 = 0;
              local_6fc = 0;
              local_6f8 = 0;
              local_6f0 = 0;
              local_728 = 0;
              local_6e8.allocator = local_710;
              if ((local_69c - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) < 0) ||
                 (iVar1 <= local_69c - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8)))
              {
                for (local_3bc = 0; local_3bc < (int)local_6e8.cstep; local_3bc = local_3bc + 1) {
                  *(ulong *)((long)local_6e8.data + (long)local_3bc * 8) = local_698;
                }
              }
              else {
                local_778.w = in_RSI->w;
                local_778.h = in_RSI->h;
                local_778.elemsize = in_RSI->elemsize;
                local_778.elempack = in_RSI->elempack;
                local_7a0 = in_RSI->allocator;
                local_778.data =
                     (void *)((long)in_RSI->data +
                             (long)local_778.w * (long)local_778.h *
                             (long)(local_69c -
                                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8)) *
                             local_778.elemsize + in_RSI->cstep * (long)local_688 * in_RSI->elemsize
                             );
                local_778.cstep = (long)local_778.w * (long)local_778.h;
                local_6e8.c = 1;
                local_6e8.d = 1;
                local_6e8.dims = 2;
                local_6e8.refcount = (int *)0x0;
                local_6f8 = 0;
                local_6fc = 0;
                local_700 = 0;
                local_704 = 0;
                local_718 = 0;
                local_720 = 0;
                local_728 = 0;
                local_730 = 0;
                local_778.c = 1;
                local_778.d = 1;
                local_778.dims = 2;
                local_778.refcount = (int *)0x0;
                local_6f0 = 0;
                local_708 = 0;
                local_7c0 = 0;
                local_7b0 = 0;
                local_7a8 = 0;
                local_798 = 0;
                local_794 = 0;
                local_790 = 0;
                local_78c = 0;
                local_788 = 0;
                local_780 = 0;
                local_7b8 = 0;
                lVar5 = *(long *)(*in_RDI + -0x18);
                local_778.allocator = local_7a0;
                padding_constant_pack8_int8_sse
                          (&local_778,&local_6e8,*(int *)((long)in_RDI + lVar5 + 0xd0),
                           *(int *)((long)in_RDI + lVar5 + 0xd4),
                           *(int *)((long)in_RDI + lVar5 + 0xd8),
                           *(int *)((long)in_RDI + lVar5 + 0xdc),local_698);
                if (local_778.refcount != (int *)0x0) {
                  LOCK();
                  iVar7 = *local_778.refcount;
                  *local_778.refcount = *local_778.refcount + -1;
                  UNLOCK();
                  if (iVar7 == 1) {
                    if (local_778.allocator == (Allocator *)0x0) {
                      if (local_778.data != (void *)0x0) {
                        free(local_778.data);
                      }
                    }
                    else {
                      (*(local_778.allocator)->_vptr_Allocator[3])
                                (local_778.allocator,local_778.data);
                    }
                  }
                }
                local_778.data = (void *)0x0;
                local_778.elemsize = 0;
                local_778.elempack = 0;
                local_778.dims = 0;
                local_778.w = 0;
                local_778.h = 0;
                local_778.d = 0;
                local_778.c = 0;
                local_778.cstep = 0;
                local_778.refcount = (int *)0x0;
              }
              pMVar11 = &local_6e8;
              if (local_6e8.refcount != (int *)0x0) {
                LOCK();
                iVar7 = *local_6e8.refcount;
                *local_6e8.refcount = *local_6e8.refcount + -1;
                UNLOCK();
                if (iVar7 == 1) {
                  if (local_6e8.allocator == (Allocator *)0x0) {
                    if (local_6e8.data != (void *)0x0) {
                      free(local_6e8.data);
                    }
                  }
                  else {
                    (*(local_6e8.allocator)->_vptr_Allocator[3])(local_6e8.allocator,local_6e8.data)
                    ;
                  }
                }
              }
              pMVar11->data = (void *)0x0;
              pMVar11->elemsize = 0;
              pMVar11->elempack = 0;
              pMVar11->dims = 0;
              pMVar11->w = 0;
              pMVar11->h = 0;
              pMVar11->d = 0;
              pMVar11->c = 0;
              pMVar11->cstep = 0;
              pMVar11->refcount = (int *)0x0;
            }
          }
          return 0;
        }
        return -100;
      }
    }
  }
  local_808._0_8_ = in_RSI->data;
  local_808._8_8_ = in_RSI->refcount;
  local_808._16_8_ = in_RSI->elemsize;
  local_808._24_4_ = in_RSI->elempack;
  local_808._32_8_ = in_RSI->allocator;
  local_7e0 = in_RSI->dims;
  local_7dc = in_RSI->w;
  local_7d8 = in_RSI->h;
  local_7d4 = in_RSI->d;
  local_7d0 = in_RSI->c;
  local_7c8 = in_RSI->cstep;
  if ((Allocator *)local_808._8_8_ != (Allocator *)0x0) {
    LOCK();
    *(int *)&((Allocator *)local_808._8_8_)->_vptr_Allocator =
         *(int *)&((Allocator *)local_808._8_8_)->_vptr_Allocator + 1;
    UNLOCK();
  }
  if (iVar4 != 1) {
    convert_packing(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                    (int)((ulong)local_808 >> 0x20),(Option *)local_808);
  }
  iVar7 = Padding::forward((Padding *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                           (Mat *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                           in_stack_fffffffffffffa40,
                           (Option *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
  puVar10 = (undefined8 *)local_808;
  if ((Allocator *)local_808._8_8_ != (Allocator *)0x0) {
    LOCK();
    iVar12 = *(int *)(_func_int ***)local_808._8_8_;
    *(int *)(_func_int ***)local_808._8_8_ = *(int *)(_func_int ***)local_808._8_8_ + -1;
    UNLOCK();
    if (iVar12 == 1) {
      if ((Allocator *)local_808._32_8_ == (Allocator *)0x0) {
        if ((void *)local_808._0_8_ != (void *)0x0) {
          free((void *)local_808._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_808._32_8_)[3])(local_808._32_8_,local_808._0_8_);
      }
    }
  }
  *puVar10 = 0;
  puVar10[2] = 0;
  *(undefined4 *)(puVar10 + 3) = 0;
  *(undefined4 *)(puVar10 + 5) = 0;
  *(undefined4 *)((long)puVar10 + 0x2c) = 0;
  *(undefined4 *)(puVar10 + 6) = 0;
  *(undefined4 *)((long)puVar10 + 0x34) = 0;
  *(undefined4 *)(puVar10 + 7) = 0;
  puVar10[8] = 0;
  puVar10[1] = 0;
  return iVar7;
}

Assistant:

int Padding_x86::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}